

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * strPadRight(string *__return_storage_ptr__,string *str,size_t newSize,char filler)

{
  int iVar1;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  string postfix;
  int cnt;
  char filler_local;
  size_t newSize_local;
  string *str_local;
  
  postfix.field_2._M_local_buf[0xf] = filler;
  iVar1 = std::__cxx11::string::size();
  postfix.field_2._8_4_ = (int)newSize - iVar1;
  std::__cxx11::string::string((string *)local_48);
  for (local_4c = 0; local_4c < (int)postfix.field_2._8_4_; local_4c = local_4c + 1) {
    std::__cxx11::string::operator+=((string *)local_48,postfix.field_2._M_local_buf[0xf]);
  }
  std::operator+(__return_storage_ptr__,str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string strPadRight(const string& str, const size_t newSize, const char filler)
{
    const int cnt = static_cast<int>(newSize - str.size());
    string postfix;
    for (int i = 0; i < cnt; i++) postfix += filler;
    return str + postfix;
}